

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O1

void point_double(pt_prj_t_conflict2 *Q,pt_prj_t_conflict2 *P)

{
  uint64_t *arg1;
  uint64_t *out1;
  uint64_t *arg1_00;
  uint64_t *out1_00;
  fe_t_conflict1 t1;
  fe_t_conflict1 t4;
  uint64_t local_1c8;
  long lStack_1c0;
  long local_1b8;
  long lStack_1b0;
  long local_1a8;
  long lStack_1a0;
  long local_198;
  long lStack_190;
  long local_188;
  long lStack_180;
  uint64_t local_178 [10];
  uint64_t local_128;
  long lStack_120;
  long local_118;
  long lStack_110;
  long local_108;
  long lStack_100;
  long local_f8;
  long lStack_f0;
  long local_e8;
  long lStack_e0;
  uint64_t local_d8;
  long lStack_d0;
  long local_c8;
  long lStack_c0;
  long local_b8;
  long lStack_b0;
  long local_a8;
  long lStack_a0;
  long local_98;
  long lStack_90;
  uint64_t local_88;
  long lStack_80;
  long local_78;
  long lStack_70;
  long local_68;
  long lStack_60;
  long local_58;
  long lStack_50;
  long local_48;
  long lStack_40;
  
  arg1 = P->Y;
  arg1_00 = P->Z;
  out1 = Q->Y;
  out1_00 = Q->Z;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(&local_88,P->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(local_178,arg1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_square(&local_1c8,arg1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_d8,P->X,arg1);
  local_d8 = local_d8 * 2;
  lStack_d0 = lStack_d0 * 2;
  local_c8 = local_c8 * 2;
  lStack_c0 = lStack_c0 * 2;
  local_b8 = local_b8 * 2;
  lStack_b0 = lStack_b0 * 2;
  local_a8 = local_a8 * 2;
  lStack_a0 = lStack_a0 * 2;
  local_98 = local_98 * 2;
  lStack_90 = lStack_90 * 2;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_d8,&local_d8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_128,arg1,arg1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(out1_00,P->X,arg1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(out1_00,out1_00,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(out1_00,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(out1,const_b,&local_1c8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_sub(out1,out1,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(out1,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(Q->X,out1,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(Q->X,Q->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(out1,Q->X,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(out1,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_sub(Q->X,local_178,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(Q->X,Q->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(out1,local_178,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(out1,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(out1,Q->X,out1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(Q->X,Q->X,&local_d8);
  local_d8 = local_1c8 * 2;
  lStack_d0 = lStack_1c0 * 2;
  local_c8 = local_1b8 * 2;
  lStack_c0 = lStack_1b0 * 2;
  local_b8 = local_1a8 * 2;
  lStack_b0 = lStack_1a0 * 2;
  local_a8 = local_198 * 2;
  lStack_a0 = lStack_190 * 2;
  local_98 = local_188 * 2;
  lStack_90 = lStack_180 * 2;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_d8,&local_d8);
  local_1c8 = local_1c8 + local_d8;
  lStack_1c0 = lStack_1c0 + lStack_d0;
  local_1b8 = local_1b8 + local_c8;
  lStack_1b0 = lStack_1b0 + lStack_c0;
  local_1a8 = local_1a8 + local_b8;
  lStack_1a0 = lStack_1a0 + lStack_b0;
  local_198 = local_198 + local_a8;
  lStack_190 = lStack_190 + lStack_a0;
  local_188 = local_188 + local_98;
  lStack_180 = lStack_180 + lStack_90;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_1c8,&local_1c8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(out1_00,const_b,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_sub(out1_00,out1_00,&local_1c8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(out1_00,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_sub(out1_00,out1_00,&local_88);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(out1_00,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(&local_d8,out1_00,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_d8,&local_d8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(out1_00,out1_00,&local_d8);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(out1_00,out1_00);
  local_d8 = local_88 * 2;
  lStack_d0 = lStack_80 * 2;
  local_c8 = local_78 * 2;
  lStack_c0 = lStack_70 * 2;
  local_b8 = local_68 * 2;
  lStack_b0 = lStack_60 * 2;
  local_a8 = local_58 * 2;
  lStack_a0 = lStack_50 * 2;
  local_98 = local_48 * 2;
  lStack_90 = lStack_40 * 2;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_d8,&local_d8);
  local_88 = local_88 + local_d8;
  lStack_80 = lStack_80 + lStack_d0;
  local_78 = local_78 + local_c8;
  lStack_70 = lStack_70 + lStack_c0;
  local_68 = local_68 + local_b8;
  lStack_60 = lStack_60 + lStack_b0;
  local_58 = local_58 + local_a8;
  lStack_50 = lStack_50 + lStack_a0;
  local_48 = local_48 + local_98;
  lStack_40 = lStack_40 + lStack_90;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_88,&local_88);
  local_88 = (local_88 - local_1c8) + 0x1ffffffffffb8e;
  lStack_80 = (lStack_80 - lStack_1c0) + 0xffffffffffffe;
  local_78 = (local_78 - local_1b8) + 0xffffffffffffe;
  lStack_70 = (lStack_70 - lStack_1b0) + 0xffffffffffffe;
  local_68 = (local_68 - local_1a8) + 0xffffffffffffe;
  lStack_60 = (lStack_60 - lStack_1a0) + 0x1ffffffffffffe;
  local_58 = (local_58 - local_198) + 0xffffffffffffe;
  lStack_50 = (lStack_50 - lStack_190) + 0xffffffffffffe;
  local_48 = (local_48 - local_188) + 0xffffffffffffe;
  lStack_40 = (lStack_40 - lStack_180) + 0xffffffffffffe;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_88,&local_88);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(&local_88,&local_88,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(out1,out1,&local_88);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(out1,out1);
  local_88 = local_128 * 2;
  lStack_80 = lStack_120 * 2;
  local_78 = local_118 * 2;
  lStack_70 = lStack_110 * 2;
  local_68 = local_108 * 2;
  lStack_60 = lStack_100 * 2;
  local_58 = local_f8 * 2;
  lStack_50 = lStack_f0 * 2;
  local_48 = local_e8 * 2;
  lStack_40 = lStack_e0 * 2;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(&local_88,&local_88);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(out1_00,&local_88,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_sub(Q->X,Q->X,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(Q->X,Q->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(out1_00,&local_88,local_178);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(out1_00,out1_00,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(out1_00,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(out1_00,out1_00,out1_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(out1_00,out1_00);
  return;
}

Assistant:

static void point_double(pt_prj_t *Q, const pt_prj_t *P) {
    /* temporary variables */
    fe_t t0, t1, t2, t3, t4;
    /* constants */
    const limb_t *b = const_b;
    /* set pointers for legacy curve arith */
    const limb_t *X = P->X;
    const limb_t *Y = P->Y;
    const limb_t *Z = P->Z;
    limb_t *X3 = Q->X;
    limb_t *Y3 = Q->Y;
    limb_t *Z3 = Q->Z;

    /* the curve arith formula */
    fiat_id_tc26_gost_3410_2012_512_paramSetB_square(t0, X);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_square(t1, Y);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_square(t2, Z);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(t3, X, Y);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(t3, t3, t3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(t4, Y, Z);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(Z3, X, Z);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(Z3, Z3, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(Y3, b, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_sub(Y3, Y3, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(X3, Y3, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(Y3, X3, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_sub(X3, t1, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(Y3, t1, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(Y3, X3, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(X3, X3, t3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(t3, t2, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(t2, t2, t3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(Z3, b, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_sub(Z3, Z3, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_sub(Z3, Z3, t0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(t3, Z3, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(Z3, Z3, t3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(t3, t0, t0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(t0, t3, t0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_sub(t0, t0, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(t0, t0, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(Y3, Y3, t0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(t0, t4, t4);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(Z3, t0, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_sub(X3, X3, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(Z3, t0, t1);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(Z3, Z3, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(Z3, Z3, Z3);
}